

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e6623f::TRDescriptor::TRDescriptor
          (TRDescriptor *this,
          unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          *internal_key,
          vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          *descs,vector<int,_std::allocator<int>_> *depths)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer piVar4;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ret;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  local_98;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::reserve(&local_78,1);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
  ::
  emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
            ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
              *)&local_78,internal_key);
  puVar1 = (descs->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (descs->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (descs->
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (descs->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (descs->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (descs->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = local_48;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar1;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tr","");
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)&PTR__DescriptorImpl_00b3fb98;
  (this->super_DescriptorImpl).m_pubkey_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_DescriptorImpl).m_pubkey_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_DescriptorImpl).m_pubkey_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_DescriptorImpl).m_name._M_dataplus._M_p =
       (pointer)&(this->super_DescriptorImpl).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_DescriptorImpl).m_name,local_58,local_50 + (long)local_58);
  (this->super_DescriptorImpl).m_subdescriptor_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar1;
  (this->super_DescriptorImpl).m_subdescriptor_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  (this->super_DescriptorImpl).m_subdescriptor_args.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_78);
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)&PTR__TRDescriptor_00b40318;
  piVar4 = (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
  (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar4;
  (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((long)(this->super_DescriptorImpl).m_subdescriptor_args.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_DescriptorImpl).m_subdescriptor_args.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 ==
      (long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_subdescriptor_args.size() == m_depths.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                ,0x4bd,
                "(anonymous namespace)::TRDescriptor::TRDescriptor(std::unique_ptr<PubkeyProvider>, std::vector<std::unique_ptr<DescriptorImpl>>, std::vector<int>)"
               );
}

Assistant:

TRDescriptor(std::unique_ptr<PubkeyProvider> internal_key, std::vector<std::unique_ptr<DescriptorImpl>> descs, std::vector<int> depths) :
        DescriptorImpl(Vector(std::move(internal_key)), std::move(descs), "tr"), m_depths(std::move(depths))
    {
        assert(m_subdescriptor_args.size() == m_depths.size());
    }